

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O0

void __thiscall
chrono::ChFrame<double>::TransformParentToLocal
          (ChFrame<double> *this,ChFrame<double> *parent,ChFrame<double> *local)

{
  ChQuaternion<double> local_78;
  ChQuaternion<double> local_58;
  ChVector<double> local_38;
  ChFrame<double> *local_20;
  ChFrame<double> *local_local;
  ChFrame<double> *parent_local;
  ChFrame<double> *this_local;
  
  local_20 = local;
  local_local = parent;
  parent_local = this;
  TransformParentToLocal(&local_38,this,&(parent->coord).pos);
  ChQuaternion<double>::GetConjugate(&local_78,&(this->coord).rot);
  ChQuaternion<double>::operator%(&local_58,&local_78,&(local_local->coord).rot);
  SetCoord(local,&local_38,&local_58);
  return;
}

Assistant:

void TransformParentToLocal(
        const ChFrame<Real>& parent,  ///< frame to transform, given in parent coordinates
        ChFrame<Real>& local          ///< transformed frame, in local coordinates, will be stored here
        ) const {
        local.SetCoord(TransformParentToLocal(parent.coord.pos), coord.rot.GetConjugate() % parent.coord.rot);
    }